

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Ptr __thiscall
core::image::create_for_type(image *this,ImageType type,int width,int height,int channels)

{
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ptr PVar2;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000014,width)
  ;
  switch(type) {
  case IMAGE_TYPE_UINT8:
    Image<unsigned_char>::create((Image<unsigned_char> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_UINT16:
    Image<unsigned_short>::create((Image<unsigned_short> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_UINT32:
    Image<unsigned_int>::create((Image<unsigned_int> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_UINT64:
    Image<unsigned_long>::create((Image<unsigned_long> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_SINT8:
    Image<signed_char>::create((Image<signed_char> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_SINT16:
    Image<short>::create((Image<short> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_SINT32:
    Image<int>::create((Image<int> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_SINT64:
    Image<long>::create((Image<long> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_FLOAT:
    Image<float>::create((Image<float> *)local_28,width,height,channels);
    break;
  case IMAGE_TYPE_DOUBLE:
    Image<double>::create((Image<double> *)local_28,width,height,channels);
    break;
  default:
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    goto LAB_0011045b;
  }
  _Var1._M_pi = local_20._M_pi;
  *(undefined1 (*) [8])this = local_28;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_28 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  _Var1._M_pi = extraout_RDX;
LAB_0011045b:
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ImageBase::Ptr
create_for_type (ImageType type, int width, int height, int channels)
{
    switch (type)
    {
        case IMAGE_TYPE_UINT8:
            return Image<uint8_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT16:
            return Image<uint16_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT32:
            return Image<uint32_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT64:
            return Image<uint64_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT8:
            return Image<int8_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT16:
            return Image<int16_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT32:
            return Image<int32_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT64:
            return Image<int64_t>::create(width, height, channels);
        case IMAGE_TYPE_FLOAT:
            return Image<float>::create(width, height, channels);
        case IMAGE_TYPE_DOUBLE:
            return Image<double>::create(width, height, channels);
        default:
            break;
    }

    return ImageBase::Ptr(nullptr);
}